

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread-link-test.cpp
# Opt level: O0

void verify_msg(msg_t read_msg,char *portname,int value,char *test_id,int line)

{
  int iVar1;
  char *__rhs;
  char *in_RCX;
  int in_EDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  char *in_RDI;
  char *arg_str;
  string test_string;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 b;
  undefined4 in_stack_fffffffffffffee4;
  char *in_stack_fffffffffffffee8;
  uint idx;
  char *in_stack_fffffffffffffef0;
  char *in_stack_ffffffffffffff00;
  allocator<char> *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  string local_d8 [32];
  rtosc_arg_t local_b8;
  string local_a8 [32];
  char *local_88;
  string local_80 [55];
  undefined1 local_49 [53];
  int local_14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  char *local_8;
  
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_49;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,in_RCX,in_stack_ffffffffffffff10);
  std::allocator<char>::~allocator((allocator<char> *)local_49);
  std::operator+(local_10,in_stack_ffffffffffffff00);
  std::__cxx11::string::c_str();
  assert_str_eq(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                in_stack_fffffffffffffedc);
  std::__cxx11::string::~string(local_80);
  __rhs = rtosc_argument_string(local_8);
  local_88 = __rhs;
  std::operator+(local_10,__rhs);
  std::__cxx11::string::c_str();
  assert_str_eq(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                in_stack_fffffffffffffedc);
  idx = (uint)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  std::__cxx11::string::~string(local_a8);
  iVar1 = strcmp(local_88,"i");
  if (iVar1 == 0) {
    local_b8 = rtosc_argument(in_stack_fffffffffffffef0,idx);
    b = local_b8._0_4_;
    std::operator+(local_10,__rhs);
    std::__cxx11::string::c_str();
    assert_int_eq(local_14,b,(char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),0
                 );
    std::__cxx11::string::~string(local_d8);
  }
  std::__cxx11::string::~string((string *)(local_49 + 1));
  return;
}

Assistant:

void verify_msg(rtosc::msg_t read_msg, const char *portname, int value, const char *test_id, int line)
{
    const std::string test_string = test_id;

    assert_str_eq(portname, read_msg, (test_string + " (portname)").c_str(), line);
    const char* arg_str = rtosc_argument_string(read_msg);
    assert_str_eq("i", arg_str, (test_string + " (arg type)").c_str(), line);
    if(!strcmp(arg_str, "i"))
        assert_int_eq(value, rtosc_argument(read_msg, 0).i, (test_string + " (arg value)").c_str(), line);
}